

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  pointer pSVar2;
  pointer pvVar3;
  pointer pAVar4;
  size_type sVar5;
  ostream *poVar6;
  long *plVar7;
  pointer pSVar8;
  pointer pAVar9;
  int iVar10;
  pointer pvVar11;
  string local_970;
  int local_94c;
  string outputQuadDir;
  string outputLexDir;
  string srcfileName;
  string outputInstDir;
  string outputDAGDir;
  string outputAsmDir;
  string local_888;
  string outputTableDir;
  vector<QuadTuple,_std::allocator<QuadTuple>_> quadVec;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  vector<Token,_std::allocator<Token>_> tokenVec;
  vector<QuadTuple,_std::allocator<QuadTuple>_> local_760;
  IdentiferTable identiferTable;
  KeyWordTable keyWordTable;
  StringTable stringTable;
  DelimiterTable delimiterTable;
  CharTable charTable;
  FloatTable floatTable;
  IntTable intTable;
  ofstream out;
  filebuf local_530 [240];
  ios_base local_440 [264];
  Scanner sc;
  Parse parse;
  
  srcfileName._M_dataplus._M_p = (pointer)&srcfileName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&srcfileName,"../src.txt","");
  outputLexDir._M_dataplus._M_p = (pointer)&outputLexDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outputLexDir,"../lex.txt","");
  outputQuadDir._M_dataplus._M_p = (pointer)&outputQuadDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outputQuadDir,"../quad.txt","");
  outputAsmDir._M_dataplus._M_p = (pointer)&outputAsmDir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outputAsmDir,"../asm.txt","");
  sVar5 = srcfileName._M_string_length;
  outputDAGDir._M_dataplus._M_p = (pointer)&outputDAGDir.field_2;
  outputDAGDir._M_string_length = 0;
  outputDAGDir.field_2._M_local_buf[0] = '\0';
  outputInstDir._M_dataplus._M_p = (pointer)&outputInstDir.field_2;
  outputInstDir._M_string_length = 0;
  outputInstDir.field_2._M_local_buf[0] = '\0';
  outputTableDir._M_dataplus._M_p = (pointer)&outputTableDir.field_2;
  outputTableDir._M_string_length = 0;
  outputTableDir.field_2._M_local_buf[0] = '\0';
  if (argc == 0xc) {
    pcVar1 = argv[1];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&srcfileName,0,(char *)sVar5,(ulong)pcVar1);
    sVar5 = outputLexDir._M_string_length;
    pcVar1 = argv[3];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&outputLexDir,0,(char *)sVar5,(ulong)pcVar1);
    sVar5 = outputQuadDir._M_string_length;
    pcVar1 = argv[5];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&outputQuadDir,0,(char *)sVar5,(ulong)pcVar1);
    sVar5 = outputDAGDir._M_string_length;
    pcVar1 = argv[7];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&outputDAGDir,0,(char *)sVar5,(ulong)pcVar1);
    sVar5 = outputInstDir._M_string_length;
    pcVar1 = argv[9];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&outputInstDir,0,(char *)sVar5,(ulong)pcVar1);
    sVar5 = outputTableDir._M_string_length;
    pcVar1 = argv[0xb];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&outputTableDir,0,(char *)sVar5,(ulong)pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"srcpath: ",9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,srcfileName._M_dataplus._M_p,
                        srcfileName._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lexPath: ",9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,outputLexDir._M_dataplus._M_p,
                        outputLexDir._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"quadPath: ",10);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,outputQuadDir._M_dataplus._M_p,
                        outputQuadDir._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"targetpath: ",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,outputAsmDir._M_dataplus._M_p,
                        outputAsmDir._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"outputDAGDir: ",0xe);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,outputDAGDir._M_dataplus._M_p,
                        outputDAGDir._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"outputInstDir: ",0xf);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,outputInstDir._M_dataplus._M_p,
                        outputInstDir._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    KeyWordTable::KeyWordTable(&keyWordTable);
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &identiferTable.
          super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .index._M_t._M_impl.super__Rb_tree_header._M_header;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         identiferTable.
         super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DelimiterTable::DelimiterTable(&delimiterTable);
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header;
    intTable.super_Table<int>.tokenTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    intTable.super_Table<int>.tokenTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    intTable.super_Table<int>.tokenTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header;
    floatTable.super_Table<double>.tokenTable.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    floatTable.super_Table<double>.tokenTable.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    floatTable.super_Table<double>.tokenTable.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header;
    charTable.super_Table<char>.tokenTable.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    charTable.super_Table<char>.tokenTable.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charTable.super_Table<char>.tokenTable.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &stringTable.
          super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .index._M_t._M_impl.super__Rb_tree_header._M_header;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tokenVec.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tokenVec.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tokenVec.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    quadVec.super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    quadVec.super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    quadVec.super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         stringTable.
         super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Scanner::Scanner(&sc,&keyWordTable,&identiferTable,&delimiterTable,&intTable,&floatTable,
                     &charTable,&stringTable,&tokenVec,&symbolTable);
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_798,srcfileName._M_dataplus._M_p,
               srcfileName._M_dataplus._M_p + srcfileName._M_string_length);
    Scanner::scan(&sc,&local_798);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
    }
    local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7b8,outputLexDir._M_dataplus._M_p,
               outputLexDir._M_dataplus._M_p + outputLexDir._M_string_length);
    Scanner::showLex(&sc,&local_7b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
      operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
    }
    Parse::Parse(&parse,&quadVec,&tokenVec,&symbolTable,&keyWordTable,&identiferTable,
                 &delimiterTable,&intTable,&floatTable,&charTable,&stringTable);
    Parse::parse(&parse);
    local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7d8,outputQuadDir._M_dataplus._M_p,
               outputQuadDir._M_dataplus._M_p + outputQuadDir._M_string_length);
    Parse::print(&parse,&local_7d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
      operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
    }
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::vector(&local_760,&quadVec);
    local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7f8,outputDAGDir._M_dataplus._M_p,
               outputDAGDir._M_dataplus._M_p + outputDAGDir._M_string_length);
    local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_818,outputInstDir._M_dataplus._M_p,
               outputInstDir._M_dataplus._M_p + outputInstDir._M_string_length);
    test(&local_760,&local_7f8,&local_818);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._M_dataplus._M_p != &local_818.field_2) {
      operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
      operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
    }
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::~vector(&local_760);
    std::ofstream::ofstream(&out);
    std::ofstream::open((string *)&out,(_Ios_Openmode)&outputTableDir);
    pvVar3 = symbolTable.symbolTable.
             super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (symbolTable.symbolTable.
        super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        symbolTable.symbolTable.
        super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar10 = 0;
      pvVar11 = symbolTable.symbolTable.
                super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_94c = iVar10;
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&out,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pSVar2 = (pvVar11->
                 super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pSVar8 = (pvVar11->
                      super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>).
                      _M_impl.super__Vector_impl_data._M_start; pSVar8 != pSVar2;
            pSVar8 = pSVar8 + 1) {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&out,(pSVar8->name)._M_dataplus._M_p,
                              (pSVar8->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          Parse::toSymTypeName_abi_cxx11_(&local_970,&parse,&pSVar8->type);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_970._M_dataplus._M_p,local_970._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          Parse::toCatName_abi_cxx11_(&local_888,&parse,pSVar8->cat);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_888._M_dataplus._M_p,local_888._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          plVar7 = (long *)std::ostream::operator<<(poVar6,pSVar8->vall);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_888._M_dataplus._M_p != &local_888.field_2) {
            operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_970._M_dataplus._M_p != &local_970.field_2) {
            operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
          }
        }
        iVar10 = local_94c + 1;
        pvVar11 = pvVar11 + 1;
      } while (pvVar11 != pvVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,anon_var_dwarf_7f99c,9);
    std::ios::widen((char)(ostream *)&out + (char)*(undefined8 *)(_out + -0x18));
    std::ostream::put((char)&out);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Low ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"up ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"clen ",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"type ",5);
    std::ios::widen((char)(ostream *)&out + (char)*(undefined8 *)(_out + -0x18));
    std::ostream::put((char)&out);
    std::ostream::flush();
    pAVar4 = symbolTable.arrayTableVec.super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (symbolTable.arrayTableVec.super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>._M_impl.
        super__Vector_impl_data._M_start !=
        symbolTable.arrayTableVec.super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pAVar9 = symbolTable.arrayTableVec.super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        Parse::toSymTypeName_abi_cxx11_(&local_970,&parse,&pAVar9->type);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_970._M_dataplus._M_p,local_970._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_970._M_dataplus._M_p != &local_970.field_2) {
          operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
        }
        pAVar9 = pAVar9 + 1;
      } while (pAVar9 != pAVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,anon_var_dwarf_7f9fd,9);
    std::ios::widen((char)(ostream *)&out + (char)*(undefined8 *)(_out + -0x18));
    std::ostream::put((char)&out);
    std::ostream::flush();
    std::ofstream::close();
    _out = _VTT;
    *(undefined8 *)(&out + *(long *)(_VTT + -0x18)) = __filebuf;
    std::filebuf::~filebuf(local_530);
    std::ios_base::~ios_base(local_440);
    Parse::~Parse(&parse);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::~vector(&quadVec);
    std::vector<Token,_std::allocator<Token>_>::~vector(&tokenVec);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&stringTable.
                 super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .index._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stringTable);
    std::
    _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::~_Rb_tree(&charTable.super_Table<char>.index._M_t);
    if (charTable.super_Table<char>.tokenTable.super__Vector_base<char,_std::allocator<char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(charTable.super_Table<char>.tokenTable.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)charTable.super_Table<char>.tokenTable.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)charTable.super_Table<char>.tokenTable.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_int>,_std::_Select1st<std::pair<const_double,_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
    ::~_Rb_tree(&floatTable.super_Table<double>.index._M_t);
    if (floatTable.super_Table<double>.tokenTable.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(floatTable.super_Table<double>.tokenTable.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)floatTable.super_Table<double>.tokenTable.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)floatTable.super_Table<double>.tokenTable.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&intTable.super_Table<int>.index._M_t);
    if (intTable.super_Table<int>.tokenTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(intTable.super_Table<int>.tokenTable.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)intTable.super_Table<int>.tokenTable.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)intTable.super_Table<int>.tokenTable.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&delimiterTable.
                 super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .index._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&delimiterTable);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&identiferTable.
                 super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .index._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&identiferTable);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&keyWordTable.
                 super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .index._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&keyWordTable);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invaild filename",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputTableDir._M_dataplus._M_p != &outputTableDir.field_2) {
    operator_delete(outputTableDir._M_dataplus._M_p,
                    CONCAT71(outputTableDir.field_2._M_allocated_capacity._1_7_,
                             outputTableDir.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputInstDir._M_dataplus._M_p != &outputInstDir.field_2) {
    operator_delete(outputInstDir._M_dataplus._M_p,
                    CONCAT71(outputInstDir.field_2._M_allocated_capacity._1_7_,
                             outputInstDir.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputDAGDir._M_dataplus._M_p != &outputDAGDir.field_2) {
    operator_delete(outputDAGDir._M_dataplus._M_p,
                    CONCAT71(outputDAGDir.field_2._M_allocated_capacity._1_7_,
                             outputDAGDir.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputAsmDir._M_dataplus._M_p != &outputAsmDir.field_2) {
    operator_delete(outputAsmDir._M_dataplus._M_p,outputAsmDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputQuadDir._M_dataplus._M_p != &outputQuadDir.field_2) {
    operator_delete(outputQuadDir._M_dataplus._M_p,outputQuadDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputLexDir._M_dataplus._M_p != &outputLexDir.field_2) {
    operator_delete(outputLexDir._M_dataplus._M_p,outputLexDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)srcfileName._M_dataplus._M_p != &srcfileName.field_2) {
    operator_delete(srcfileName._M_dataplus._M_p,srcfileName.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    /*
     * 词法分析结果的输出
     */
    string srcfileName = "../src.txt";
    string outputLexDir = "../lex.txt";
    string outputQuadDir = "../quad.txt";
    string outputAsmDir = "../asm.txt";
    string outputDAGDir;
    string outputInstDir;
    string outputTableDir;
    if(argc != 12) {
        cout << "Invaild filename" << endl;
        return 0;
    } else {
        srcfileName = argv[1];
        outputLexDir = argv[3];
        outputQuadDir = argv[5];
        outputDAGDir = argv[7];
        outputInstDir = argv[9];
        outputTableDir = argv[11];
        cout << "srcpath: " << srcfileName << endl;
        cout << "lexPath: " << outputLexDir << endl;
        cout << "quadPath: " << outputQuadDir << endl;
        cout << "targetpath: " << outputAsmDir << endl;
        cout << "outputDAGDir: " << outputDAGDir << endl;
        cout << "outputInstDir: " << outputInstDir << endl;
    }
    KeyWordTable keyWordTable;
    IdentiferTable identiferTable;
    DelimiterTable delimiterTable;
    IntTable intTable;
    FloatTable floatTable;
    CharTable charTable;
    StringTable stringTable;
    vector<Token> tokenVec;
    vector<QuadTuple> quadVec;
    Scanner sc(keyWordTable, identiferTable, delimiterTable, intTable, floatTable, charTable, stringTable, tokenVec, symbolTable);
    sc.scan(srcfileName);
    sc.showLex(outputLexDir);
//    fclose(stdout);
//    cout << tokenVec.size() << endl;
    //symbolTable.print();
    /*
    Parse::Parse(vector<QuadTurple> &quadVec, vector<Token> &tokenVec, SymbolTable &st, KeyWordTable &kt,
                 IdentiferTable &it, DelimiterTable &dt, IntTable &inTable, FloatTable &ft, CharTable &ct,
                 StringTable &stTable) : quadVec(quadVec), tokenVec(tokenVec), st(st), keyWordTable(kt), identiferTable(it), delimiterTable(dt), intTable(inTable), floatTable(ft), charTable(ct), stringTable(stTable){
        this->curIndex = 0;
        this->curFun = -1;
        this->funCnt = 0;
    }
    */
    Parse parse(quadVec, tokenVec, symbolTable, keyWordTable, identiferTable, delimiterTable, intTable, floatTable, charTable, stringTable);
    parse.parse();
    parse.print(outputQuadDir);
    test(quadVec, outputDAGDir, outputInstDir);
    //symbolTable.print();
    int index = 0;
    int cur;
    ofstream out;
    out.open(outputTableDir, ios::out | ios::trunc);
    for (auto &i : symbolTable.symbolTable) {
        out << index++  << ":" << endl;
        cur = 0;
        for (auto &j : i) {
            out  << j.name << " " << parse.toSymTypeName(j.type) <<  " " <<  parse.toCatName(j.cat) << " " << j.vall<< endl;
        }
    }
    out << "数组表" << endl;
    out << "Low " <<"up " << "clen " << "type " << endl;
    for (auto &i : symbolTable.arrayTableVec) {
        out << i.low << " " << i.up << " " << i.clen << " " << parse.toSymTypeName(i.type) << endl;
    }


    out << "函数表" << endl;
//    out << "Low " <<"up " << "clen " << "type " << endl;
//    for (auto &i : symbolTable.functionTableVec) {
//        out << i.paramNum << " " << i. << " " << i.clen << " " << parse.toSymTypeName(i.type) << endl;
//    }
    out.close();
//    test(quadVec);
    //cout << symbolTable.isTempName("t5", "main") << endl;
//    cout << symbolTable.getAddr("a", "main").first << " " << symbolTable.getAddr("a", "main").second << endl;
    return 0;
}